

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O1

void zinf_norm_error(int nrhs,SuperMatrix *X,doublecomplex *xtrue)

{
  int *piVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  int iVar5;
  doublecomplex *z;
  double dVar6;
  doublecomplex temp;
  double local_70;
  double local_68;
  doublecomplex local_40;
  
  if (0 < nrhs) {
    piVar1 = (int *)X->Store;
    lVar2 = *(long *)(piVar1 + 2);
    iVar5 = 0;
    do {
      local_68 = NAN;
      if (0 < X->nrow) {
        z = (doublecomplex *)((long)(*piVar1 * iVar5) * 0x10 + lVar2);
        local_68 = 0.0;
        lVar4 = 0;
        local_70 = 0.0;
        pdVar3 = &xtrue->i;
        do {
          local_40.r = z->r - ((doublecomplex *)(pdVar3 + -1))->r;
          local_40.i = z->i - *pdVar3;
          dVar6 = z_abs(&local_40);
          if (local_68 <= dVar6) {
            local_68 = z_abs(&local_40);
          }
          dVar6 = z_abs(z);
          if (local_70 <= dVar6) {
            local_70 = z_abs(z);
          }
          lVar4 = lVar4 + 1;
          pdVar3 = pdVar3 + 2;
          z = z + 1;
        } while (lVar4 < X->nrow);
        local_68 = local_68 / local_70;
      }
      printf("||X - Xtrue||/||X|| = %e\n",local_68);
      iVar5 = iVar5 + 1;
    } while (iVar5 != nrhs);
  }
  return;
}

Assistant:

void zinf_norm_error(int nrhs, SuperMatrix *X, doublecomplex *xtrue)
{
    DNformat *Xstore;
    double err, xnorm;
    doublecomplex *Xmat, *soln_work;
    doublecomplex temp;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
        z_sub(&temp, &soln_work[i], &xtrue[i]);
	err = SUPERLU_MAX(err, z_abs(&temp));
	xnorm = SUPERLU_MAX(xnorm, z_abs(&soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}